

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall IteratorTest::accessIteratorOperations<false>(IteratorTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  bool bVar1;
  size_t j;
  reference piVar2;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *this_00;
  reference piVar3;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar4;
  pointer piVar5;
  pointer pTVar6;
  pointer pTVar7;
  int i;
  long lVar8;
  size_t sVar9;
  size_t j_5;
  int i_3;
  Iterator<TestType,_false,_std::allocator<unsigned_long>_> it_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&it_3,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            (&it,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)&it_3);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 1) {
    piVar2 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&it);
    it_3.view_._0_1_ = *piVar2 == this->data_[lVar8];
    test((bool *)&it_3);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end((iterator *)&it_3,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,false,std::allocator<unsigned_long>> *)&it,
                  (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&it_3);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  this_00 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar2 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(this_00);
  it_3.view_._0_1_ = *piVar2 == 0x2e;
  test((bool *)&it_3);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_00._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_00._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_00._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&it_3,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it_3);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
    it_3.view_._0_1_ = *piVar3 == this->data_[lVar8];
    test((bool *)&it_3);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)&it_3,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                  (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it_3);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar4);
  it_3.view_._0_1_ = *piVar3 == 0x2e;
  test((bool *)&it_3);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  begin_05._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_05._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_05._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it_3,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it_3);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_158);
  for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
    it_3.view_._0_1_ = *piVar3 == this->data_[lVar8];
    test((bool *)&it_3);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end((iterator *)&it_3,&v);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                  (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&it_3);
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar4);
  it_3.view_._0_1_ = *piVar3 == 0x2e;
  test((bool *)&it_3);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (piVar5 = (pointer)0x0; piVar5 != (pointer)0x18; piVar5 = (pointer)((long)piVar5 + 1)) {
    (&v.data_)[(long)piVar5] = piVar5;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&it)
  ;
  begin_01._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_01._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_01._M_current = 0x18;
  andres::View<TestType,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<TestType,false,std::allocator<unsigned_long>> *)&it,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(pointer)&v,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_3);
  andres::View<TestType,_false,_std::allocator<unsigned_long>_>::begin
            (&it_3,(View<TestType,_false,_std::allocator<unsigned_long>_> *)&it);
  for (sVar9 = 0; sVar9 != 0x18; sVar9 = sVar9 + 1) {
    pTVar6 = andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::operator->(&it_3);
    shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar9 == pTVar6->data_;
    test((bool *)&shape_2);
    andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::operator++(&it_3);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (piVar5 = (pointer)0x0; piVar5 != (pointer)0x18; piVar5 = (pointer)((long)piVar5 + 1)) {
    (&v.data_)[(long)piVar5] = piVar5;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&it)
  ;
  begin_02._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_02._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_02._M_current = 0x18;
  andres::View<TestType,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<TestType,true,std::allocator<unsigned_long>> *)&it,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(pointer)&v,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_3);
  andres::View<TestType,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&it_3,(View<TestType,_true,_std::allocator<unsigned_long>_> *)&it);
  for (sVar9 = 0; sVar9 != 0x18; sVar9 = sVar9 + 1) {
    pTVar7 = andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator->
                       ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&it_3);
    shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar9 == pTVar7->data_;
    test((bool *)&shape_2);
    andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&it_3);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (piVar5 = (pointer)0x0; piVar5 != (pointer)0x18; piVar5 = (pointer)((long)piVar5 + 1)) {
    (&v.data_)[(long)piVar5] = piVar5;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&it);
  begin_06._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_06._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_06._M_current = 0x18;
  andres::View<TestType,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<TestType,false,std::allocator<unsigned_long>> *)&it,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(pointer)&v,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_3);
  andres::View<TestType,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&shape,(View<TestType,_false,_std::allocator<unsigned_long>_> *)&it);
  andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&it_3,
             (Iterator<TestType,_false,_std::allocator<unsigned_long>_> *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_158);
  for (sVar9 = 0; sVar9 != 0x18; sVar9 = sVar9 + 1) {
    pTVar7 = andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator->
                       ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&it_3);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar9 == pTVar7->data_;
    test((bool *)&shape);
    andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&it_3);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_03._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_03._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_03._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&it_3,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            (&it,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)&it_3);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (sVar9 = 0; sVar9 != 0x18; sVar9 = sVar9 + 1) {
    piVar2 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator[](&it,sVar9);
    it_3.view_._0_1_ = *piVar2 == this->data_[sVar9];
    test((bool *)&it_3);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&it_3,&v);
  bVar1 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,false,std::allocator<unsigned_long>> *)&it,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&it_3);
  if (bVar1) {
    piVar2 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator[](&it,4);
    if (*piVar2 != this->data_[4]) goto LAB_001859c7;
    piVar2 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator[](&it,0x10);
    shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar2 == this->data_[0x10];
  }
  else {
LAB_001859c7:
    shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_04._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_04._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_04._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&it_3,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it_3);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (sVar9 = 0; sVar9 != 0x18; sVar9 = sVar9 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,sVar9);
    it_3.view_._0_1_ = *piVar3 == this->data_[sVar9];
    test((bool *)&it_3);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&it_3,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  bVar1 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it_3);
  if (bVar1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,4);
    if (*piVar3 != this->data_[4]) goto LAB_00185b10;
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,0x10);
    shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == this->data_[0x10];
  }
  else {
LAB_00185b10:
    shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  begin_07._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_07._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_07._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it_3,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it_3);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_158);
  for (sVar9 = 0; sVar9 != 0x18; sVar9 = sVar9 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,sVar9);
    it_3.view_._0_1_ = *piVar3 == this->data_[sVar9];
    test((bool *)&it_3);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&it_3,&v);
  bVar1 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&it_3);
  if (bVar1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,4);
    if (*piVar3 == this->data_[4]) {
      piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                         ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,0x10);
      shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = *piVar3 == this->data_[0x10];
      goto LAB_00185c71;
    }
  }
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = false;
LAB_00185c71:
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_3.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void IteratorTest::accessIteratorOperations() {
    // operator*
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator->
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, constTarget> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, constTarget> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<TestType, true> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, false> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    // operator[]
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
}